

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O1

bool_t memIsZero_fast(void *buf,size_t count)

{
  size_t sVar1;
  
  if (7 < count) {
    do {
      if (*buf != 0) {
        return 0;
      }
      count = count - 8;
      buf = (void *)((long)buf + 8);
    } while (7 < count);
  }
  if (count != 0) {
    sVar1 = 0;
    do {
      if (*(char *)((long)buf + sVar1) != '\0') {
        return 0;
      }
      sVar1 = sVar1 + 1;
    } while (count != sVar1);
  }
  return 1;
}

Assistant:

bool_t FAST(memIsZero)(const void* buf, size_t count)
{
	ASSERT(memIsValid(buf, count));
	for (; count >= O_PER_W; count -= O_PER_W, buf = (const word*)buf + 1)
		if (*(const word*)buf)
			return FALSE;
	for (; count--; buf = (const octet*)buf + 1)
		if (*(const octet*)buf)
			return FALSE;
	return TRUE;
}